

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_parser.cpp
# Opt level: O0

bool anon_unknown.dwarf_4bca7::string_startswith(string *s,string *c)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  undefined8 local_28;
  size_t i;
  string *c_local;
  string *s_local;
  
  uVar2 = std::__cxx11::string::length();
  uVar3 = std::__cxx11::string::length();
  if (uVar2 < uVar3) {
    s_local._7_1_ = false;
  }
  else {
    local_28 = 0;
    while( true ) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
      cVar1 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)c);
      bVar5 = false;
      if (cVar1 == *pcVar4) {
        uVar2 = std::__cxx11::string::length();
        bVar5 = local_28 < uVar2;
      }
      if (!bVar5) break;
      local_28 = local_28 + 1;
    }
    uVar2 = std::__cxx11::string::length();
    s_local._7_1_ = local_28 == uVar2;
  }
  return s_local._7_1_;
}

Assistant:

bool string_startswith(const std::string & s, const std::string & c) {
		if (s.length() < c.length()) {
			return false;
		}

		size_t i(0);
		while (s[i] == c[i] and i < c.length() ){
			++i;
		}

		return i == c.length();

	}